

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::detail::make_digest_authentication_header
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Request *req,
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *auth,size_t cnonce_count,string *cnonce,string *username,string *password,bool is_proxy
            )

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  char cVar5;
  int iVar6;
  const_iterator cVar7;
  long lVar8;
  mapped_type *pmVar9;
  long *plVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long *plVar14;
  ulong *puVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined8 uVar17;
  ulong uVar18;
  char *pcVar19;
  code *pcVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  mapped_type opaque;
  string qop;
  string algo;
  string nc;
  string response;
  stringstream ss;
  undefined1 auStack_558 [8];
  long *local_550;
  long local_548;
  long local_540;
  undefined8 uStack_538;
  string *local_530;
  key_type local_528;
  key_type local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  ulong *local_4c8;
  long local_4c0;
  ulong local_4b8;
  long lStack_4b0;
  ulong *local_4a8;
  long local_4a0;
  ulong local_498;
  long lStack_490;
  key_type local_488;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  long *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long lStack_3b0;
  key_type local_3a8;
  ulong *local_388;
  long local_380;
  ulong local_378;
  long lStack_370;
  ulong *local_368;
  long local_360;
  ulong local_358;
  long lStack_350;
  key_type local_348;
  long *local_328;
  long local_320;
  long local_318;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  long *local_308 [2];
  long local_2f8 [2];
  string *local_2e8;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0;
  undefined7 uStack_2cf;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  key_type local_2a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_280;
  long *local_278;
  long local_270;
  long local_268;
  long lStack_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  undefined1 local_1f8 [8];
  pointer local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined8 uStack_1d8;
  uint auStack_1d0 [22];
  ios_base local_178 [112];
  char acStack_108 [152];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2e0 = &local_2d0;
  local_2d8 = 0;
  local_2d0 = 0;
  local_530 = username;
  local_2e8 = cnonce;
  local_280 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1f8);
  lVar8 = *(long *)(local_1e8._M_allocated_capacity - 0x18);
  if (acStack_108[lVar8 + 1] == '\0') {
    cVar5 = std::ios::widen((char)auStack_558 + (char)lVar8 + 'p');
    acStack_108[lVar8] = cVar5;
    acStack_108[lVar8 + 1] = '\x01';
  }
  acStack_108[lVar8] = '0';
  *(undefined8 *)((long)auStack_1d0 + *(long *)(local_1e8._M_allocated_capacity - 0x18) + -8) = 8;
  *(uint *)((long)auStack_1d0 + *(long *)(local_1e8._M_allocated_capacity - 0x18)) =
       *(uint *)((long)auStack_1d0 + *(long *)(local_1e8._M_allocated_capacity - 0x18)) & 0xffffffb5
       | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2e0,(string *)&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                             local_428.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
  std::ios_base::~ios_base(local_178);
  local_428._M_string_length = 0;
  local_428.field_2._M_local_buf[0] = '\0';
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  local_1f8 = (undefined1  [8])&local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"qop","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_1f8);
  p_Var1 = &(auth->_M_t)._M_impl.super__Rb_tree_header;
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar7._M_node != p_Var1) {
    local_1f8 = (undefined1  [8])&local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"qop","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(auth,(key_type *)local_1f8);
    std::__cxx11::string::_M_assign((string *)&local_428);
    if (local_1f8 != (undefined1  [8])&local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
    }
    pcVar19 = "auth-int";
    lVar8 = std::__cxx11::string::find((char *)&local_428,0x175989,0);
    if (lVar8 == -1) {
      pcVar19 = "auth";
      lVar8 = std::__cxx11::string::find((char *)&local_428,0x175992,0);
      if (lVar8 == -1) {
        local_428._M_string_length = 0;
        *local_428._M_dataplus._M_p = '\0';
        goto LAB_0013096a;
      }
    }
    std::__cxx11::string::_M_replace
              ((ulong)&local_428,0,(char *)local_428._M_string_length,(ulong)pcVar19);
  }
LAB_0013096a:
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"MD5","");
  local_1f8 = (undefined1  [8])&local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"algorithm","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_1f8);
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar7._M_node != p_Var1) {
    local_1f8 = (undefined1  [8])&local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"algorithm","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(auth,(key_type *)local_1f8);
    std::__cxx11::string::_M_assign((string *)local_308);
    if (local_1f8 != (undefined1  [8])&local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
    }
  }
  local_2c0 = &local_2b0;
  local_2b8 = 0;
  local_2b0 = 0;
  iVar6 = std::__cxx11::string::compare((char *)local_308);
  if (iVar6 == 0) {
    pcVar20 = SHA_256;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)local_308);
    pcVar20 = MD5;
    if (iVar6 == 0) {
      pcVar20 = SHA_512;
    }
  }
  pcVar2 = (local_530->_M_dataplus)._M_p;
  local_550 = &local_540;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_550,pcVar2,pcVar2 + local_530->_M_string_length);
  std::__cxx11::string::append((char *)&local_550);
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"realm","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(auth,&local_528);
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_550,(ulong)(pmVar9->_M_dataplus)._M_p);
  paVar16 = &local_508.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_508.field_2._M_allocated_capacity = *psVar12;
    local_508.field_2._8_8_ = plVar10[3];
    local_508._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_508.field_2._M_allocated_capacity = *psVar12;
    local_508._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_508._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_508);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_4e8.field_2._M_allocated_capacity = *psVar12;
    local_4e8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_4e8.field_2._M_allocated_capacity = *psVar12;
    local_4e8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_4e8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_4e8,(ulong)(password->_M_dataplus)._M_p);
  local_1f8 = (undefined1  [8])&local_1e8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar13) {
    local_1e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1e8._8_8_ = plVar10[3];
  }
  else {
    local_1e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1f8 = (undefined1  [8])*plVar10;
  }
  local_1f0 = (pointer)plVar10[1];
  *plVar10 = (long)paVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != paVar16) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if (local_550 != &local_540) {
    operator_delete(local_550,local_540 + 1);
  }
  pcVar2 = (req->method)._M_dataplus._M_p;
  local_508._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,pcVar2,pcVar2 + (req->method)._M_string_length);
  std::__cxx11::string::append((char *)&local_508);
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_508,(ulong)(req->path)._M_dataplus._M_p);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_4e8.field_2._M_allocated_capacity = *psVar12;
    local_4e8.field_2._8_8_ = plVar10[3];
  }
  else {
    local_4e8.field_2._M_allocated_capacity = *psVar12;
    local_4e8._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_4e8._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != paVar16) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_428);
  if (iVar6 == 0) {
    (*pcVar20)(&local_550);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_550,0,(char *)0x0,0x176f4a);
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_508.field_2._M_allocated_capacity = *psVar12;
      local_508.field_2._8_8_ = plVar10[3];
      local_508._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_508.field_2._M_allocated_capacity = *psVar12;
      local_508._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_508._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_508._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != paVar16) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if (local_550 != &local_540) {
      operator_delete(local_550,local_540 + 1);
    }
  }
  if ((char *)local_428._M_string_length == (char *)0x0) {
    (*pcVar20)(&local_448,local_1f8);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_448);
    local_4c8 = &local_4b8;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_4b8 = *puVar15;
      lStack_4b0 = plVar10[3];
    }
    else {
      local_4b8 = *puVar15;
      local_4c8 = (ulong *)*plVar10;
    }
    local_4c0 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"nonce","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(auth,&local_488);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_4c8,(ulong)(pmVar9->_M_dataplus)._M_p);
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_458 = *plVar14;
      lStack_450 = plVar10[3];
      local_468 = &local_458;
    }
    else {
      local_458 = *plVar14;
      local_468 = (long *)*plVar10;
    }
    local_460 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_468);
    local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_528.field_2._M_allocated_capacity = *puVar15;
      local_528.field_2._8_8_ = plVar10[3];
    }
    else {
      local_528.field_2._M_allocated_capacity = *puVar15;
      local_528._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_528._M_string_length = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    (*pcVar20)(&local_4a8,&local_4e8);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      uVar17 = local_528.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_4a0 + local_528._M_string_length) {
      uVar18 = 0xf;
      if (local_4a8 != &local_498) {
        uVar18 = local_498;
      }
      if (uVar18 < local_4a0 + local_528._M_string_length) goto LAB_00131665;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_4a8,0,(char *)0x0,(ulong)local_528._M_dataplus._M_p);
    }
    else {
LAB_00131665:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_528,(ulong)local_4a8);
    }
    local_550 = &local_540;
    plVar10 = puVar11 + 2;
    if ((long *)*puVar11 == plVar10) {
      local_540 = *plVar10;
      uStack_538 = puVar11[3];
    }
    else {
      local_540 = *plVar10;
      local_550 = (long *)*puVar11;
    }
    local_548 = puVar11[1];
    *puVar11 = plVar10;
    puVar11[1] = 0;
    *(undefined1 *)plVar10 = 0;
    (*pcVar20)(&local_508,&local_550);
    std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != paVar16) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if (local_550 != &local_540) {
      operator_delete(local_550,local_540 + 1);
    }
    if (local_4a8 != &local_498) {
      operator_delete(local_4a8,local_498 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
    }
    if (local_468 != &local_458) {
      operator_delete(local_468,local_458 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,local_4b8 + 1);
    }
    local_318 = local_438;
    local_328 = local_448;
    if (local_448 != &local_438) goto LAB_001317e2;
  }
  else {
    (*pcVar20)(&local_328,local_1f8);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_328);
    local_408 = &local_3f8;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_3f8 = *plVar14;
      lStack_3f0 = plVar10[3];
    }
    else {
      local_3f8 = *plVar14;
      local_408 = (long *)*plVar10;
    }
    local_400 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"nonce","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(auth,&local_348);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_408,(ulong)(pmVar9->_M_dataplus)._M_p);
    local_3e8 = &local_3d8;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_3d8 = *plVar14;
      lStack_3d0 = plVar10[3];
    }
    else {
      local_3d8 = *plVar14;
      local_3e8 = (long *)*plVar10;
    }
    local_3e0 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    local_3c8 = &local_3b8;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_3b8 = *plVar14;
      lStack_3b0 = plVar10[3];
    }
    else {
      local_3b8 = *plVar14;
      local_3c8 = (long *)*plVar10;
    }
    local_3c0 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_3c8,(ulong)local_2e0);
    local_4a8 = &local_498;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_498 = *puVar15;
      lStack_490 = plVar10[3];
    }
    else {
      local_498 = *puVar15;
      local_4a8 = (ulong *)*plVar10;
    }
    local_4a0 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_4a8);
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    psVar12 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_488.field_2._M_allocated_capacity = *psVar12;
      local_488.field_2._8_8_ = plVar10[3];
    }
    else {
      local_488.field_2._M_allocated_capacity = *psVar12;
      local_488._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_488._M_string_length = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_488,(ulong)(local_2e8->_M_dataplus)._M_p);
    local_448 = &local_438;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_438 = *plVar14;
      lStack_430 = plVar10[3];
    }
    else {
      local_438 = *plVar14;
      local_448 = (long *)*plVar10;
    }
    local_440 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_448);
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_4b8 = *puVar15;
      lStack_4b0 = plVar10[3];
      local_4c8 = &local_4b8;
    }
    else {
      local_4b8 = *puVar15;
      local_4c8 = (ulong *)*plVar10;
    }
    local_4c0 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_4c8,(ulong)local_428._M_dataplus._M_p);
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_458 = *plVar14;
      lStack_450 = plVar10[3];
      local_468 = &local_458;
    }
    else {
      local_458 = *plVar14;
      local_468 = (long *)*plVar10;
    }
    local_460 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_468);
    local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_528.field_2._M_allocated_capacity = *puVar15;
      local_528.field_2._8_8_ = plVar10[3];
    }
    else {
      local_528.field_2._M_allocated_capacity = *puVar15;
      local_528._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_528._M_string_length = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    (*pcVar20)(&local_3a8,&local_4e8);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      uVar17 = local_528.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_3a8._M_string_length + local_528._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        uVar17 = local_3a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_3a8._M_string_length + local_528._M_string_length)
      goto LAB_0013128a;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_3a8,0,(char *)0x0,(ulong)local_528._M_dataplus._M_p);
    }
    else {
LAB_0013128a:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_528,(ulong)local_3a8._M_dataplus._M_p);
    }
    local_550 = &local_540;
    plVar10 = puVar11 + 2;
    if ((long *)*puVar11 == plVar10) {
      local_540 = *plVar10;
      uStack_538 = puVar11[3];
    }
    else {
      local_540 = *plVar10;
      local_550 = (long *)*puVar11;
    }
    local_548 = puVar11[1];
    *puVar11 = plVar10;
    puVar11[1] = 0;
    *(undefined1 *)plVar10 = 0;
    (*pcVar20)(&local_508,&local_550);
    std::__cxx11::string::operator=((string *)&local_2c0,(string *)&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    if (local_550 != &local_540) {
      operator_delete(local_550,local_540 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
    }
    if (local_468 != &local_458) {
      operator_delete(local_468,local_458 + 1);
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,local_4b8 + 1);
    }
    if (local_448 != &local_438) {
      operator_delete(local_448,local_438 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if (local_4a8 != &local_498) {
      operator_delete(local_4a8,local_498 + 1);
    }
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8,local_3b8 + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_328 != &local_318) {
LAB_001317e2:
      operator_delete(local_328,local_318 + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
  }
  local_1f8 = (undefined1  [8])&local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"opaque","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_1f8);
  if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
  }
  else {
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"opaque","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(auth,&local_508);
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    pcVar2 = (pmVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e8,pcVar2,pcVar2 + pmVar9->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != &local_508.field_2) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
  }
  std::operator+(&local_348,"Digest username=\"",local_530);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_348);
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_318 = *plVar14;
    uStack_310 = (undefined4)plVar10[3];
    uStack_30c = *(undefined4 *)((long)plVar10 + 0x1c);
    local_328 = &local_318;
  }
  else {
    local_318 = *plVar14;
    local_328 = (long *)*plVar10;
  }
  local_320 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"realm","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(auth,&local_3a8);
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_328,(ulong)(pmVar9->_M_dataplus)._M_p);
  local_408 = &local_3f8;
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_3f8 = *plVar14;
    lStack_3f0 = plVar10[3];
  }
  else {
    local_3f8 = *plVar14;
    local_408 = (long *)*plVar10;
  }
  local_400 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_408);
  local_3e8 = &local_3d8;
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_3d8 = *plVar14;
    lStack_3d0 = plVar10[3];
  }
  else {
    local_3d8 = *plVar14;
    local_3e8 = (long *)*plVar10;
  }
  local_3e0 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"nonce","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(auth,&local_2a0);
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_3e8,(ulong)(pmVar9->_M_dataplus)._M_p);
  local_3c8 = &local_3b8;
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_3b8 = *plVar14;
    lStack_3b0 = plVar10[3];
  }
  else {
    local_3b8 = *plVar14;
    local_3c8 = (long *)*plVar10;
  }
  local_3c0 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3c8);
  local_4a8 = &local_498;
  puVar15 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar15) {
    local_498 = *puVar15;
    lStack_490 = plVar10[3];
  }
  else {
    local_498 = *puVar15;
    local_4a8 = (ulong *)*plVar10;
  }
  local_4a0 = plVar10[1];
  *plVar10 = (long)puVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_4a8,(ulong)(req->path)._M_dataplus._M_p);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_488.field_2._M_allocated_capacity = *psVar12;
    local_488.field_2._8_8_ = plVar10[3];
  }
  else {
    local_488.field_2._M_allocated_capacity = *psVar12;
    local_488._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_488._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_488);
  local_448 = &local_438;
  plVar14 = plVar10 + 2;
  if ((long *)*plVar10 == plVar14) {
    local_438 = *plVar14;
    lStack_430 = plVar10[3];
  }
  else {
    local_438 = *plVar14;
    local_448 = (long *)*plVar10;
  }
  local_440 = plVar10[1];
  *plVar10 = (long)plVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_448,(ulong)local_308[0]);
  sVar4 = local_428._M_string_length;
  puVar15 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar15) {
    local_4b8 = *puVar15;
    lStack_4b0 = plVar10[3];
    local_4c8 = &local_4b8;
  }
  else {
    local_4b8 = *puVar15;
    local_4c8 = (ulong *)*plVar10;
  }
  local_4c0 = plVar10[1];
  *plVar10 = (long)puVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_530 = (string *)CONCAT71(local_530._1_7_,(char *)local_428._M_string_length != (char *)0x0);
  if ((char *)local_428._M_string_length == (char *)0x0) {
    local_368 = &local_358;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,", response=\"","");
  }
  else {
    std::operator+(&local_50,", qop=",&local_428);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_278 = &local_268;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_268 = *plVar14;
      lStack_260 = plVar10[3];
    }
    else {
      local_268 = *plVar14;
      local_278 = (long *)*plVar10;
    }
    local_270 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_2e0);
    local_258 = &local_248;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_248 = *plVar14;
      lStack_240 = plVar10[3];
    }
    else {
      local_248 = *plVar14;
      local_258 = (long *)*plVar10;
    }
    local_250 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_238 = &local_228;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_228 = *plVar14;
      lStack_220 = plVar10[3];
    }
    else {
      local_228 = *plVar14;
      local_238 = (long *)*plVar10;
    }
    local_230 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_238,(ulong)(local_2e8->_M_dataplus)._M_p);
    local_218 = &local_208;
    plVar14 = plVar10 + 2;
    if ((long *)*plVar10 == plVar14) {
      local_208 = *plVar14;
      lStack_200 = plVar10[3];
    }
    else {
      local_208 = *plVar14;
      local_218 = (long *)*plVar10;
    }
    local_210 = plVar10[1];
    *plVar10 = (long)plVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_218);
    local_368 = &local_358;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_358 = *puVar15;
      lStack_350 = plVar10[3];
    }
    else {
      local_358 = *puVar15;
      local_368 = (ulong *)*plVar10;
    }
    local_360 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
  }
  uVar18 = 0xf;
  if (local_4c8 != &local_4b8) {
    uVar18 = local_4b8;
  }
  if (uVar18 < (ulong)(local_360 + local_4c0)) {
    uVar18 = 0xf;
    if (local_368 != &local_358) {
      uVar18 = local_358;
    }
    if (uVar18 < (ulong)(local_360 + local_4c0)) goto LAB_00131f6b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_368,0,(char *)0x0,(ulong)local_4c8);
  }
  else {
LAB_00131f6b:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c8,(ulong)local_368);
  }
  local_468 = &local_458;
  plVar10 = puVar11 + 2;
  if ((long *)*puVar11 == plVar10) {
    local_458 = *plVar10;
    lStack_450 = puVar11[3];
  }
  else {
    local_458 = *plVar10;
    local_468 = (long *)*puVar11;
  }
  local_460 = puVar11[1];
  *puVar11 = plVar10;
  puVar11[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_2c0);
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_528.field_2._M_allocated_capacity = *psVar12;
    local_528.field_2._8_8_ = plVar10[3];
  }
  else {
    local_528.field_2._M_allocated_capacity = *psVar12;
    local_528._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_528._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_528);
  sVar3 = local_4e8._M_string_length;
  local_1f8 = (undefined1  [8])&local_1e8;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 == paVar16) {
    local_1e8._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_1e8._8_8_ = plVar10[3];
  }
  else {
    local_1e8._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_1f8 = (undefined1  [8])*plVar10;
  }
  local_1f0 = (pointer)plVar10[1];
  *plVar10 = (long)paVar16;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if (local_4e8._M_string_length == 0) {
    local_388 = &local_378;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"");
  }
  else {
    std::operator+(&local_70,", opaque=\"",&local_4e8);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_388 = &local_378;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_378 = *puVar15;
      lStack_370 = plVar10[3];
    }
    else {
      local_378 = *puVar15;
      local_388 = (ulong *)*plVar10;
    }
    local_380 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
  }
  uVar17 = 0xf;
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    uVar17 = local_1e8._M_allocated_capacity;
  }
  if ((ulong)uVar17 < (ulong)(local_380 + (long)local_1f0)) {
    uVar18 = 0xf;
    if (local_388 != &local_378) {
      uVar18 = local_378;
    }
    if ((ulong)(local_380 + (long)local_1f0) <= uVar18) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_1f8);
      goto LAB_001321e5;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_1f8,(ulong)local_388);
LAB_001321e5:
  local_550 = &local_540;
  plVar10 = puVar11 + 2;
  if ((long *)*puVar11 == plVar10) {
    local_540 = *plVar10;
    uStack_538 = puVar11[3];
  }
  else {
    local_540 = *plVar10;
    local_550 = (long *)*puVar11;
  }
  local_548 = puVar11[1];
  *puVar11 = plVar10;
  puVar11[1] = 0;
  *(undefined1 *)plVar10 = 0;
  if (local_388 != &local_378) {
    operator_delete(local_388,local_378 + 1);
  }
  if ((sVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,local_458 + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358 + 1);
  }
  if ((char *)sVar4 != (char *)0x0) {
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,local_268 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,local_4b8 + 1);
  }
  this = local_280;
  if (local_448 != &local_438) {
    operator_delete(local_448,local_438 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,local_498 + 1);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,local_3b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,local_3d8 + 1);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408,local_3f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,local_318 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  local_1f8 = (undefined1  [8])0x174fbc;
  if (is_proxy) {
    local_1f8 = (undefined1  [8])0x174fb6;
  }
  local_1f0 = local_1e8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_550,(undefined1 *)(local_548 + (long)local_550));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,(char *)local_1f8,(allocator<char> *)&local_528);
  paVar16 = &(this->second).field_2;
  (this->second)._M_dataplus._M_p = (pointer)paVar16;
  if (local_1f0 == local_1e8._M_local_buf + 8) {
    paVar16->_M_allocated_capacity = local_1e8._8_8_;
    *(undefined8 *)((long)&(this->second).field_2 + 8) = uStack_1d8;
  }
  else {
    (this->second)._M_dataplus._M_p = local_1f0;
    (this->second).field_2._M_allocated_capacity = local_1e8._8_8_;
  }
  (this->second)._M_string_length = local_1e8._M_allocated_capacity;
  if (local_550 != &local_540) {
    operator_delete(local_550,local_540 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],local_2f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                             local_428.field_2._M_local_buf[0]) + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,CONCAT71(uStack_2cf,local_2d0) + 1);
  }
  return this;
}

Assistant:

inline std::pair<std::string, std::string> make_digest_authentication_header(
            const Request& req, const std::map<std::string, std::string>& auth,
            size_t cnonce_count, const std::string& cnonce, const std::string& username,
            const std::string& password, bool is_proxy = false) {
            std::string nc;
            {
                std::stringstream ss;
                ss << std::setfill('0') << std::setw(8) << std::hex << cnonce_count;
                nc = ss.str();
            }

            std::string qop;
            if (auth.find("qop") != auth.end()) {
                qop = auth.at("qop");
                if (qop.find("auth-int") != std::string::npos) {
                    qop = "auth-int";
                } else if (qop.find("auth") != std::string::npos) {
                    qop = "auth";
                } else {
                    qop.clear();
                }
            }

            std::string algo = "MD5";
            if (auth.find("algorithm") != auth.end()) { algo = auth.at("algorithm"); }

            std::string response;
            {
                auto H = algo == "SHA-256" ? detail::SHA_256
                    : algo == "SHA-512" ? detail::SHA_512
                    : detail::MD5;

                auto A1 = username + ":" + auth.at("realm") + ":" + password;

                auto A2 = req.method + ":" + req.path;
                if (qop == "auth-int") { A2 += ":" + H(req.body); }

                if (qop.empty()) {
                    response = H(H(A1) + ":" + auth.at("nonce") + ":" + H(A2));
                } else {
                    response = H(H(A1) + ":" + auth.at("nonce") + ":" + nc + ":" + cnonce +
                        ":" + qop + ":" + H(A2));
                }
            }

            auto opaque = (auth.find("opaque") != auth.end()) ? auth.at("opaque") : "";

            auto field = "Digest username=\"" + username + "\", realm=\"" +
                auth.at("realm") + "\", nonce=\"" + auth.at("nonce") +
                "\", uri=\"" + req.path + "\", algorithm=" + algo +
                (qop.empty() ? ", response=\""
                    : ", qop=" + qop + ", nc=" + nc + ", cnonce=\"" +
                    cnonce + "\", response=\"") +
                response + "\"" +
                (opaque.empty() ? "" : ", opaque=\"" + opaque + "\"");

            auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
            return std::make_pair(key, field);
        }